

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu34x.c
# Opt level: O3

MPP_RET hal_vp9d_vdpu34x_reset(void *hal)

{
  long lVar1;
  byte bVar2;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (((byte)hal_vp9d_debug & 1) == 0) {
    *(undefined8 *)(lVar1 + 0x148) = 0;
    *(undefined8 *)(lVar1 + 0x150) = 0;
    *(undefined8 *)(lVar1 + 0x138) = 0;
    *(undefined8 *)(lVar1 + 0x140) = 0;
    *(undefined8 *)(lVar1 + 0x128) = 0;
    *(undefined8 *)(lVar1 + 0x130) = 0;
    *(undefined8 *)(lVar1 + 0x118) = 0;
    *(undefined8 *)(lVar1 + 0x120) = 0;
    *(undefined8 *)(lVar1 + 0x108) = 0;
    *(undefined8 *)(lVar1 + 0x110) = 0;
    *(undefined8 *)(lVar1 + 0xf8) = 0;
    *(undefined8 *)(lVar1 + 0x100) = 0;
    *(undefined8 *)(lVar1 + 0x158) = 0x100000000;
    *(undefined8 *)(lVar1 + 0xf0) = 0xffffffffffffffff;
    *(undefined8 *)(lVar1 + 0x238) = 0;
    *(undefined8 *)(lVar1 + 0x240) = 0;
    *(undefined8 *)(lVar1 + 0x248) = 0;
  }
  else {
    _mpp_log_l(4,"hal_vp9d_vdpu34x","(%d) enter\n","hal_vp9d_vdpu34x_reset",0x408);
    bVar2 = (byte)hal_vp9d_debug & 1;
    *(undefined8 *)(lVar1 + 0x148) = 0;
    *(undefined8 *)(lVar1 + 0x150) = 0;
    *(undefined8 *)(lVar1 + 0x138) = 0;
    *(undefined8 *)(lVar1 + 0x140) = 0;
    *(undefined8 *)(lVar1 + 0x128) = 0;
    *(undefined8 *)(lVar1 + 0x130) = 0;
    *(undefined8 *)(lVar1 + 0x118) = 0;
    *(undefined8 *)(lVar1 + 0x120) = 0;
    *(undefined8 *)(lVar1 + 0x108) = 0;
    *(undefined8 *)(lVar1 + 0x110) = 0;
    *(undefined8 *)(lVar1 + 0xf8) = 0;
    *(undefined8 *)(lVar1 + 0x100) = 0;
    *(undefined8 *)(lVar1 + 0x158) = 0x100000000;
    *(undefined8 *)(lVar1 + 0xf0) = 0xffffffffffffffff;
    *(undefined8 *)(lVar1 + 0x238) = 0;
    *(undefined8 *)(lVar1 + 0x240) = 0;
    *(undefined8 *)(lVar1 + 0x248) = 0;
    if (bVar2 != 0) {
      _mpp_log_l(4,"hal_vp9d_vdpu34x","(%d) leave\n","hal_vp9d_vdpu34x_reset",0x412);
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu34x_reset(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu34xVp9dCtx *hw_ctx = (Vdpu34xVp9dCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    memset(&hw_ctx->ls_info, 0, sizeof(hw_ctx->ls_info));
    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;
    hw_ctx->last_segid_flag = 1;
    memset(&hw_ctx->prob_ref_poc, 0, sizeof(hw_ctx->prob_ref_poc));
    hw_ctx->col_ref_poc = 0;
    hw_ctx->segid_ref_poc = 0;

    hal_vp9d_leave();

    return MPP_OK;
}